

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::localityModifiers(string *unit,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pcVar4;
  bool bVar5;
  precise_unit pVar6;
  int iVar7;
  size_t sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type sVar11;
  uint64_t uVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  precise_unit pVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nunit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  uint local_9c;
  uint64_t local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (2 < unit->_M_string_length) {
    pcVar2 = (unit->_M_dataplus)._M_p;
    if ((*pcVar2 == 'u') && ((pcVar2[1] == 'S' || (pcVar2[1] == 'K')))) {
      *pcVar2 = 'U';
    }
    lVar13 = 8;
    local_9c = 0;
    local_98 = match_flags;
    do {
      pcVar2 = *(char **)((long)&wordModifiers::modifiers._M_elems[0x26].
                                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                 .super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar13);
      sVar8 = strlen(pcVar2);
      if (sVar8 == 2) {
        pcVar3 = *(char **)((long)&localityModifiers::internationlReplacements._M_elems[0].first +
                           lVar13);
        iVar7 = strncmp(pcVar2,pcVar3,2);
        if (iVar7 != 0) {
LAB_00402d3c:
          pcVar3 = (unit->_M_dataplus)._M_p;
          cVar1 = pcVar3[1];
          if (((('\0' < cVar1) && (iVar7 = isupper((int)cVar1), iVar7 != 0)) &&
              (iVar7 = toupper((int)*pcVar3), iVar7 == *pcVar2)) && (cVar1 == pcVar2[1])) {
            *pcVar3 = (char)iVar7;
          }
          goto LAB_00402d71;
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90.field_2._M_allocated_capacity._0_2_ = 0x5f;
        local_90._M_string_length = 1;
        pbVar9 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                           (&local_90,pcVar3);
        local_c0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
        paVar10 = &pbVar9->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p == paVar10) {
          local_c0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_c0._M_string_length = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        sVar11 = unit->_M_string_length - local_c0._M_string_length;
        if (unit->_M_string_length < local_c0._M_string_length || sVar11 == 0) {
          bVar14 = false;
        }
        else {
          iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(unit,sVar11,local_c0._M_string_length,&local_c0);
          bVar14 = iVar7 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT62(local_90.field_2._M_allocated_capacity._2_6_,
                                   local_90.field_2._M_allocated_capacity._0_2_) + 1);
        }
        iVar7 = 3;
        if (!bVar14) goto LAB_00402d3c;
      }
      else {
LAB_00402d71:
        sVar8 = strlen(pcVar2);
        iVar7 = 0;
        sVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit,pcVar2,0,sVar8);
        if (sVar11 != 0xffffffffffffffff) {
          sVar8 = strlen(pcVar2);
          iVar7 = 1;
          if (sVar8 != unit->_M_string_length) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,sVar11,
                  sVar8);
            if ((sVar11 != 0) && ((unit->_M_dataplus)._M_p[sVar11 - 1] == '_')) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                    sVar11 - 1,1);
            }
            if ((sVar11 < unit->_M_string_length) && ((unit->_M_dataplus)._M_p[sVar11] == '_')) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,sVar11
                    ,1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,'_')
            ;
            pbVar9 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )unit,*(char **)((long)&localityModifiers::internationlReplacements.
                                                        _M_elems[0].first + lVar13));
            local_9c = (uint)CONCAT71((int7)((ulong)pbVar9 >> 8),1);
            iVar7 = 2;
          }
        }
      }
      if ((iVar7 != 3) && (iVar7 != 0)) goto LAB_00402e43;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 1000);
    iVar7 = 2;
LAB_00402e43:
    if (iVar7 == 2) {
      bVar14 = clearEmptySegments(unit);
      if ((local_9c & 1) != 0 || bVar14) {
        pcVar4 = (unit->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + unit->_M_string_length);
        uVar12 = local_98;
        pVar16 = unit_from_string_internal(&local_50,local_98 | 0xc00000);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (((uint)uVar12 >> 0x16 & 1) != 0) {
          return pVar16;
        }
        if (!NAN(pVar16.multiplier_) && (pVar16._8_8_ & 0xffffffff) != 0xfa94a488) {
          return pVar16;
        }
        pcVar4 = (unit->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + unit->_M_string_length);
        pVar16 = localityModifiers(&local_70,uVar12 | 0x400000);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return pVar16;
        }
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        return pVar16;
      }
      if (3 < unit->_M_string_length) {
        bVar14 = false;
        pVar16.base_units_ = (unit_data)0xfa94a488;
        pVar16.commodity_ = 0;
        pVar16.multiplier_ = NAN;
        lVar13 = 0;
        uVar12 = local_98;
        do {
          pcVar2 = *(char **)((long)localityModifiers::rotSequences._M_elems + lVar13);
          iVar7 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit,0,2,pcVar2);
          if (iVar7 == 0) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                   (ulong)((unit->_M_dataplus)._M_p[3] == '_') | 2,0xffffffffffffffff);
            if (local_c0._M_dataplus._M_p[local_c0._M_string_length - 1] == 's') {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              pop_back(&local_c0);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_c0,'_');
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(&local_c0,pcVar2);
            pVar16 = get_unit((string *)&local_c0,uVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            bVar5 = false;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,pcVar2,(allocator<char> *)&local_90);
            sVar11 = unit->_M_string_length - local_c0._M_string_length;
            if (unit->_M_string_length < local_c0._M_string_length || sVar11 == 0) {
              bVar15 = false;
            }
            else {
              iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (unit,sVar11,local_c0._M_string_length,&local_c0);
              bVar15 = iVar7 == 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            uVar12 = local_98;
            bVar5 = true;
            if (bVar15) {
              bVar5 = false;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit,unit->_M_string_length - 2,0,1,'_');
              pVar16 = get_unit(unit,uVar12);
            }
          }
          if (!bVar5) break;
          lVar13 = lVar13 + 8;
          bVar14 = lVar13 == 0x38;
        } while (!bVar14);
        if (!bVar14) {
          return pVar16;
        }
      }
    }
  }
  pVar6.base_units_ = (unit_data)0xfa94a488;
  pVar6.commodity_ = 0;
  pVar6.multiplier_ = NAN;
  return pVar6;
}

Assistant:

static precise_unit
    localityModifiers(std::string unit, std::uint64_t match_flags)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 62>
        internationlReplacements{{
            ckpair{"internationaltable", "IT"},
            ckpair{"internationalsteamtable", "IT"},
            ckpair{"international", "i"},
            ckpair{"USandBritish", "av"},
            ckpair{"US&British", "av"},
            ckpair{"USAsurvey", "US"},
            ckpair{"USsurvey", "US"},
            ckpair{"USSurvey", "US"},
            ckpair{"USdry", "US"},
            ckpair{"USA", "US"},
            ckpair{"USstatute", "US"},
            ckpair{"statutory", "US"},
            ckpair{"statute", "US"},
            ckpair{"US", "US"},
            ckpair{"shipping", "ship"},
            ckpair{"gregorian", "g"},
            ckpair{"Gregorian", "g"},
            ckpair{"synodic", "s"},
            ckpair{"sidereal", "sdr"},
            ckpair{"julian", "j"},
            ckpair{"Julian", "j"},
            ckpair{"thermochemical", "th"},
            ckpair{"hydraulic", "mech"},
            ckpair{"Th", "th"},
            ckpair{"(th)", "th"},
            ckpair{"metric", "m"},
            ckpair{"mean", "m"},
            ckpair{"imperial", "br"},
            ckpair{"Imperial", "br"},
            ckpair{"English", "br"},
            ckpair{"imp", "br"},
            ckpair{"wine", "wine"},
            ckpair{"beer", "wine"},
            ckpair{"(IT)", "IT"},
            ckpair{"troy", "tr"},
            ckpair{"apothecary", "ap"},
            ckpair{"apothecaries", "ap"},
            ckpair{"avoirdupois", "av"},
            ckpair{"Chinese", "cn"},
            ckpair{"chinese", "cn"},
            ckpair{"Canadian", "ca"},
            ckpair{"canadian", "ca"},
            ckpair{"survey", "US"},
            ckpair{"tropical", "t"},
            ckpair{"British", "br"},
            ckpair{"british", "br"},
            ckpair{"Br", "br"},
            ckpair{"BR", "br"},
            ckpair{"UK", "br"},
            ckpair{"conventional", "90"},
            ckpair{"AC", "ac"},
            ckpair{"DC", "dc"},
            ckpair{"fluid", "FL"},
            ckpair{"liquid", "FL"},
            ckpair{"fl", "FL"},
            ckpair{"15degC", "[15]"},
            ckpair{"20degC", "[20]"},
            ckpair{"59degF", "[59]"},
            ckpair{"60degF", "[60]"},
            ckpair{"39degF", "[39]"},
            ckpair{"0degC", "[00]"},
            // this should be last

            ckpair{"us", "US"},
        }};
    if (unit.size() < 3) {
        return precise::invalid;
    }
    if (unit.front() == 'u' && (unit[1] == 'S' || unit[1] == 'K')) {
        unit.front() = 'U';
    }
    bool changed = false;
    for (const auto& irep : internationlReplacements) {
        if (strlen(irep.first) == 2) {
            if (strncmp(irep.first, irep.second, 2) == 0) {
                if (ends_with(unit, std::string(1, '_') + irep.second)) {
                    continue;
                }
            }
            if (unit[1] > 0 && (std::isupper(unit[1]) != 0) &&
                (std::toupper(unit[0]) == irep.first[0]) &&
                (unit[1] == irep.first[1])) {
                unit[0] = std::toupper(unit[0]);
            }
        }
        auto fnd = unit.find(irep.first);
        if (fnd != std::string::npos) {
            auto len = strlen(irep.first);
            if (len == unit.size()) {  // this is a modifier if we are checking
                                       // the entire unit this is automatically
                                       // false
                return precise::invalid;
            }
            unit.erase(fnd, len);
            if (fnd > 0 && unit[fnd - 1] == '_') {
                unit.erase(fnd - 1, 1);
            }
            if (fnd < unit.size() && unit[fnd] == '_') {
                unit.erase(fnd, 1);
            }
            unit.push_back('_');
            unit.append(irep.second);
            changed = true;
            break;
        }
    }
    changed |= clearEmptySegments(unit);
    if (changed) {
        auto retunit = unit_from_string_internal(
            unit, match_flags | no_locality_modifiers | no_of_operator);
        if (is_error(retunit) && ((match_flags & no_locality_modifiers) == 0)) {
            return localityModifiers(unit, match_flags | no_locality_modifiers);
        }
        return retunit;
    }
    if (unit.size() < 4) {
        return precise::invalid;
    }
    static constexpr std::array<const char*, 7> rotSequences{
        {"br", "av", "ch", "IT", "th", "ap", "tr"}};
    for (const auto& seq : rotSequences) {
        if (unit.compare(0, 2, seq) == 0) {
            auto nunit = unit.substr((unit[3] == '_') ? 3 : 2);
            if (nunit.back() == 's') {
                nunit.pop_back();
            }
            nunit.push_back('_');
            nunit.append(seq);
            return get_unit(nunit, match_flags);
        }
        if (ends_with(unit, seq)) {
            unit.insert(unit.end() - 2, '_');
            return get_unit(unit, match_flags);
        }
    }

    return precise::invalid;
}